

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

bdConnection * __thiscall
bdConnectManager::findSimilarConnection(bdConnectManager *this,bdNodeId *srcId,bdNodeId *destId)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_bdProxyTuple,_bdConnection>_> local_30;
  iterator it;
  bdNodeId *destId_local;
  bdNodeId *srcId_local;
  bdConnectManager *this_local;
  
  it._M_node = (_Base_ptr)destId;
  std::_Rb_tree_iterator<std::pair<const_bdProxyTuple,_bdConnection>_>::_Rb_tree_iterator(&local_30)
  ;
  local_38 = (_Base_ptr)
             std::
             map<bdProxyTuple,_bdConnection,_std::less<bdProxyTuple>,_std::allocator<std::pair<const_bdProxyTuple,_bdConnection>_>_>
             ::begin(&this->mConnections);
  local_30._M_node = local_38;
  do {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<bdProxyTuple,_bdConnection,_std::less<bdProxyTuple>,_std::allocator<std::pair<const_bdProxyTuple,_bdConnection>_>_>
         ::end(&this->mConnections);
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) {
      return (bdConnection *)0x0;
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdProxyTuple,_bdConnection>_>::operator->
                       (&local_30);
    iVar2 = ::operator==((bdNodeId *)ppVar3,srcId);
    if (iVar2 != 0) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdProxyTuple,_bdConnection>_>::operator->
                         (&local_30);
      iVar2 = ::operator==(&(ppVar3->first).destId,(bdNodeId *)it._M_node);
      if (iVar2 != 0) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdProxyTuple,_bdConnection>_>::operator->
                           (&local_30);
        return &ppVar3->second;
      }
    }
    std::_Rb_tree_iterator<std::pair<const_bdProxyTuple,_bdConnection>_>::operator++(&local_30,0);
  } while( true );
}

Assistant:

bdConnection *bdConnectManager::findSimilarConnection(bdNodeId *srcId, bdNodeId *destId) {
	std::map<bdProxyTuple, bdConnection>::iterator it;
	for (it = mConnections.begin(); it != mConnections.end(); it++)
		if ((it->first.srcId == *srcId) && (it->first.destId == *destId))
			/* found similar connection */
			return &(it->second);
	return NULL;
}